

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void transcoding_test(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  unsigned_long uval;
  unsigned_long uval_00;
  string input1;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string pdfdoc;
  string input2;
  string other_to_utf8;
  string other;
  string other_utf8;
  string input3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string other_doc;
  string utf8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,anon_var_dwarf_4b25,(allocator<char> *)&input1);
  transcoding_test(QUtil::pdf_doc_to_utf8,QUtil::utf8_to_pdf_doc,0x7f,0xa0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional pdf doc done");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"?",(allocator<char> *)&input1);
  transcoding_test(QUtil::pdf_doc_to_utf8,QUtil::utf8_to_pdf_doc,0x18,0x1f,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional pdf doc low done");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"?",(allocator<char> *)&input1);
  transcoding_test(QUtil::win_ansi_to_utf8,QUtil::utf8_to_win_ansi,0x80,0xa0,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional win ansi done");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"?",(allocator<char> *)&input1);
  transcoding_test(QUtil::mac_roman_to_utf8,QUtil::utf8_to_mac_roman,0x80,0xff,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  poVar3 = std::operator<<((ostream *)&std::cout,"bidirectional mac roman done");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input1,anon_var_dwarf_4ba5,(allocator<char> *)&input2);
  check_analyze(&input1,true,true,false);
  std::__cxx11::string::~string((string *)&input1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input1,anon_var_dwarf_4bbf,(allocator<char> *)&input2);
  check_analyze(&input1,true,false,false);
  std::__cxx11::string::~string((string *)&input1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input1,"pi != 22/7",(allocator<char> *)&input2);
  check_analyze(&input1,false,false,false);
  std::__cxx11::string::~string((string *)&input1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input1,anon_var_dwarf_4bd7,(allocator<char> *)&input2);
  check_analyze(&input1,true,false,false);
  std::__cxx11::string::~string((string *)&input1);
  input1.field_2._M_allocated_capacity._0_4_ = 0x5100fffe;
  input1._M_string_length = 4;
  input1.field_2._M_local_buf[4] = '\0';
  input1._M_dataplus._M_p = (pointer)&input1.field_2;
  check_analyze(&input1,true,false,true);
  std::__cxx11::string::~string((string *)&input1);
  input1.field_2._M_allocated_capacity._0_4_ = 0x51feff;
  input1._M_string_length = 4;
  input1.field_2._M_local_buf[4] = '\0';
  input1._M_dataplus._M_p = (pointer)&input1.field_2;
  check_analyze(&input1,true,false,true);
  std::__cxx11::string::~string((string *)&input1);
  poVar3 = std::operator<<((ostream *)&std::cout,"analysis done");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input1,anon_var_dwarf_4c01,(allocator<char> *)&input2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input2,anon_var_dwarf_4c0d,(allocator<char> *)&input3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input3,"ab",(allocator<char> *)&output);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  bVar1 = QUtil::utf8_to_ascii(&input1,&output,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_ascii(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x192,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_ascii(&input2,&output,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_ascii(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x193,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_ascii(&input3,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_ascii(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x194,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_win_ansi(&input1,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_win_ansi(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x195,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_win_ansi(&input2,&output,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_win_ansi(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x196,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_win_ansi(&input3,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_win_ansi(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x197,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_mac_roman(&input1,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_mac_roman(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x198,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_mac_roman(&input2,&output,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_mac_roman(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x199,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_mac_roman(&input3,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_mac_roman(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19a,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&input1,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_pdf_doc(input1, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19b,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&input2,&output,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(input2, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19c,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&input3,&output,'?');
  if (!bVar1) {
    __assert_fail("QUtil::utf8_to_pdf_doc(input3, output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x19d,"void transcoding_test()");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"alternatives");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pdfdoc,anon_var_dwarf_4d13,(allocator<char> *)&utf8);
  QUtil::pdf_doc_to_utf8(&utf8,&pdfdoc);
  print_alternatives(&pdfdoc);
  print_alternatives(&utf8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&other,"quack",(allocator<char> *)&other_doc);
  print_alternatives(&other);
  std::__cxx11::string::~string((string *)&other);
  poVar3 = std::operator<<((ostream *)&std::cout,"done alternatives");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&other,"w\x18w\x19w\x1aw\x1bw\x1cw\x1dw\x1ew\x1fw\x7fw",
             (allocator<char> *)&other_doc);
  std::operator+(&other_doc,&other,anon_var_dwarf_4d5f);
  QUtil::pdf_doc_to_utf8(&other_utf8,&other_doc);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&other_utf8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&other_utf8);
  QUtil::toUTF8_abi_cxx11_(&local_b0,(QUtil *)0x9f,uval);
  std::operator+(&local_130,&other,&local_b0);
  std::operator+(&local_210,&local_130,anon_var_dwarf_6500 + 4);
  QUtil::toUTF8_abi_cxx11_(&local_d0,(QUtil *)0xad,uval_00);
  std::operator+(&other_to_utf8,&local_210,&local_d0);
  std::operator+(&other_utf8,&other_to_utf8,anon_var_dwarf_6500 + 4);
  std::__cxx11::string::~string((string *)&other_to_utf8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_b0);
  other_to_utf8._M_dataplus._M_p = (pointer)&other_to_utf8.field_2;
  other_to_utf8._M_string_length = 0;
  other_to_utf8.field_2._M_local_buf[0] = '\0';
  bVar1 = QUtil::utf8_to_pdf_doc(&other_utf8,&other_to_utf8,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(other_utf8, other_to_utf8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1b2,"void transcoding_test()");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&other_to_utf8);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"done other characters");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (transcoding_test()::fe_ff_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&transcoding_test()::fe_ff_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transcoding_test()::fe_ff_abi_cxx11_,anon_var_dwarf_4d9d,
                 (allocator<char> *)&local_210);
      __cxa_atexit(std::__cxx11::string::~string,&transcoding_test()::fe_ff_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&transcoding_test()::fe_ff_abi_cxx11_);
    }
  }
  if (transcoding_test()::ff_fe_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&transcoding_test()::ff_fe_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transcoding_test()::ff_fe_abi_cxx11_,anon_var_dwarf_60e6,
                 (allocator<char> *)&local_210);
      __cxa_atexit(std::__cxx11::string::~string,&transcoding_test()::ff_fe_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&transcoding_test()::ff_fe_abi_cxx11_);
    }
  }
  if (transcoding_test()::ef_bb_bf_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&transcoding_test()::ef_bb_bf_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transcoding_test()::ef_bb_bf_abi_cxx11_,anon_var_dwarf_60f2,
                 (allocator<char> *)&local_210);
      __cxa_atexit(std::__cxx11::string::~string,&transcoding_test()::ef_bb_bf_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&transcoding_test()::ef_bb_bf_abi_cxx11_);
    }
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&transcoding_test()::fe_ff_abi_cxx11_,&pdfdoc,'?');
  if (bVar1) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(fe_ff, pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1bc,"void transcoding_test()");
  }
  bVar1 = std::operator==(&pdfdoc,anon_var_dwarf_610a);
  if (!bVar1) {
    __assert_fail("pdfdoc == \"?\\xfe\\xff potato\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1bd,"void transcoding_test()");
  }
  bVar1 = QUtil::utf8_to_pdf_doc(&transcoding_test()::ff_fe_abi_cxx11_,&pdfdoc,'?');
  if (!bVar1) {
    bVar1 = std::operator==(&pdfdoc,anon_var_dwarf_612e);
    if (!bVar1) {
      __assert_fail("pdfdoc == \"?\\xff\\xfe potato\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x1bf,"void transcoding_test()");
    }
    bVar1 = QUtil::utf8_to_pdf_doc(&transcoding_test()::ef_bb_bf_abi_cxx11_,&pdfdoc,'?');
    if (bVar1) {
      __assert_fail("!QUtil::utf8_to_pdf_doc(ef_bb_bf, pdfdoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x1c0,"void transcoding_test()");
    }
    bVar1 = std::operator==(&pdfdoc,anon_var_dwarf_6152);
    if (!bVar1) {
      __assert_fail("pdfdoc == \"?\\xef\\xbb\\xbf potato\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x1c1,"void transcoding_test()");
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,anon_var_dwarf_6178,(allocator<char> *)&local_130);
    bVar1 = QUtil::utf8_to_pdf_doc(&local_210,&pdfdoc,'?');
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,anon_var_dwarf_6190,(allocator<char> *)&local_130);
      bVar1 = QUtil::utf8_to_pdf_doc(&local_210,&pdfdoc,'?');
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&other_to_utf8);
        std::__cxx11::string::~string((string *)&other_utf8);
        std::__cxx11::string::~string((string *)&other_doc);
        std::__cxx11::string::~string((string *)&other);
        std::__cxx11::string::~string((string *)&utf8);
        std::__cxx11::string::~string((string *)&pdfdoc);
        std::__cxx11::string::~string((string *)&output);
        std::__cxx11::string::~string((string *)&input3);
        std::__cxx11::string::~string((string *)&input2);
        std::__cxx11::string::~string((string *)&input1);
        return;
      }
      __assert_fail("QUtil::utf8_to_pdf_doc(\"\\xc3\\xaf\\xc2\\xbb\\xc2\\xbe\", pdfdoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x1c3,"void transcoding_test()");
    }
    __assert_fail("QUtil::utf8_to_pdf_doc(\"\\xc3\\xbe\\xc3\\xbe\", pdfdoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0x1c2,"void transcoding_test()");
  }
  __assert_fail("!QUtil::utf8_to_pdf_doc(ff_fe, pdfdoc)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                ,0x1be,"void transcoding_test()");
}

Assistant:

void
transcoding_test()
{
    transcoding_test(&QUtil::pdf_doc_to_utf8, &QUtil::utf8_to_pdf_doc, 127, 160, "\x9f");
    std::cout << "bidirectional pdf doc done" << std::endl;
    transcoding_test(&QUtil::pdf_doc_to_utf8, &QUtil::utf8_to_pdf_doc, 24, 31, "?");
    std::cout << "bidirectional pdf doc low done" << std::endl;
    transcoding_test(&QUtil::win_ansi_to_utf8, &QUtil::utf8_to_win_ansi, 128, 160, "?");
    std::cout << "bidirectional win ansi done" << std::endl;
    transcoding_test(&QUtil::mac_roman_to_utf8, &QUtil::utf8_to_mac_roman, 128, 255, "?");
    std::cout << "bidirectional mac roman done" << std::endl;
    check_analyze("pi = \317\200", true, true, false);
    check_analyze("pi != \317", true, false, false);
    check_analyze("pi != 22/7", false, false, false);
    check_analyze("\xE0\x80\x82", true, false, false);
    check_analyze(std::string("\xfe\xff\x00\x51", 4), true, false, true);
    check_analyze(std::string("\xff\xfe\x51\x00", 4), true, false, true);
    std::cout << "analysis done" << std::endl;
    std::string input1("a\302\277b");
    std::string input2("a\317\200b");
    std::string input3("ab");
    std::string output;
    assert(!QUtil::utf8_to_ascii(input1, output));
    assert(!QUtil::utf8_to_ascii(input2, output));
    assert(QUtil::utf8_to_ascii(input3, output));
    assert(QUtil::utf8_to_win_ansi(input1, output));
    assert(!QUtil::utf8_to_win_ansi(input2, output));
    assert(QUtil::utf8_to_win_ansi(input3, output));
    assert(QUtil::utf8_to_mac_roman(input1, output));
    assert(!QUtil::utf8_to_mac_roman(input2, output));
    assert(QUtil::utf8_to_mac_roman(input3, output));
    assert(QUtil::utf8_to_pdf_doc(input1, output));
    assert(!QUtil::utf8_to_pdf_doc(input2, output));
    assert(QUtil::utf8_to_pdf_doc(input3, output));
    std::cout << "alternatives" << std::endl;
    // char     name            mac     win     pdf-doc
    // U+0192   florin          304     203     206
    // U+00A9   copyright       251     251     251
    // U+00E9   eacute          216     351     351
    // U+017E   zcaron          -       236     236
    std::string pdfdoc = "\206\251\351\236";
    std::string utf8 = QUtil::pdf_doc_to_utf8(pdfdoc);
    print_alternatives(pdfdoc);
    print_alternatives(utf8);
    print_alternatives("quack");
    std::cout << "done alternatives" << std::endl;
    // These are characters are either valid in PDFDoc and invalid in
    // UTF-8 or the other way around.
    std::string other("w\x18w\x19w\x1aw\x1bw\x1cw\x1dw\x1ew\x1fw\x7fw");
    // cSpell: ignore xadw
    std::string other_doc = other + "\x9fw\xadw";
    std::cout << QUtil::pdf_doc_to_utf8(other_doc) << std::endl;
    std::string other_utf8 = other + QUtil::toUTF8(0x9f) + "w" + QUtil::toUTF8(0xad) + "w";
    std::string other_to_utf8;
    assert(!QUtil::utf8_to_pdf_doc(other_utf8, other_to_utf8));
    std::cout << other_to_utf8 << std::endl;
    std::cout << "done other characters" << std::endl;
    // These valid UTF8 strings when converted to PDFDoc would end up
    // with a byte sequence that would be recognized as UTF-8 or
    // UTF-16 rather than PDFDoc. A special case is required to store
    // them as UTF-16 rather than PDFDoc.
    static std::string fe_ff("\xc3\xbe\xc3\xbf potato");
    static std::string ff_fe("\xc3\xbf\xc3\xbe potato");
    static std::string ef_bb_bf("\xc3\xaf\xc2\xbb\xc2\xbf potato");
    assert(!QUtil::utf8_to_pdf_doc(fe_ff, pdfdoc));
    assert(pdfdoc == "?\xfe\xff potato");
    assert(!QUtil::utf8_to_pdf_doc(ff_fe, pdfdoc));
    assert(pdfdoc == "?\xff\xfe potato");
    assert(!QUtil::utf8_to_pdf_doc(ef_bb_bf, pdfdoc));
    assert(pdfdoc == "?\xef\xbb\xbf potato");
    assert(QUtil::utf8_to_pdf_doc("\xc3\xbe\xc3\xbe", pdfdoc));
    assert(QUtil::utf8_to_pdf_doc("\xc3\xaf\xc2\xbb\xc2\xbe", pdfdoc));
}